

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

AllocatedBlock * __thiscall ctemplate::BaseArena::AllocNewBlock(BaseArena *this,size_t block_size)

{
  ulong uVar1;
  pointer pAVar2;
  vector<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
  *pvVar3;
  char *pcVar4;
  ulong uVar5;
  AllocatedBlock *pAVar6;
  uint extraout_EDX;
  ulong uVar7;
  size_t sVar8;
  uint uVar9;
  size_t __new_size;
  BaseArena *this_00;
  
  uVar9 = this->blocks_alloced_;
  if ((ulong)uVar9 < 0x10) {
    this->blocks_alloced_ = uVar9 + 1;
    pAVar6 = this->first_blocks_ + uVar9;
    __new_size = block_size;
    this_00 = this;
  }
  else {
    if (this->overflow_blocks_ ==
        (vector<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
         *)0x0) {
      pvVar3 = (vector<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
                *)operator_new(0x18);
      (pvVar3->
      super__Vector_base<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pvVar3->
      super__Vector_base<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pvVar3->
      super__Vector_base<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      this->overflow_blocks_ = pvVar3;
    }
    this_00 = (BaseArena *)this->overflow_blocks_;
    __new_size = ((long)(this_00->status_).bytes_allocated_ -
                  (long)(((_Vector_base<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
                           *)&this_00->_vptr_BaseArena)->_M_impl).super__Vector_impl_data._M_start
                 >> 4) + 1;
    std::
    vector<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
    ::resize((vector<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
              *)this_00,__new_size);
    pAVar6 = (this->overflow_blocks_->
             super__Vector_base<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
             )._M_impl.super__Vector_impl_data._M_finish + -1;
  }
  if (this->page_aligned_ != true) {
    pcVar4 = (char *)malloc(block_size);
    pAVar6->mem = pcVar4;
    pAVar6->size = block_size;
    (this->status_).bytes_allocated_ = (this->status_).bytes_allocated_ + block_size;
    return pAVar6;
  }
  aligned_malloc((size_t)this_00,__new_size);
  if ((uint)__new_size < 0x10) {
    return this_00->first_blocks_ + (__new_size & 0xffffffff);
  }
  pvVar3 = this_00->overflow_blocks_;
  if (pvVar3 == (vector<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
                 *)0x0) {
    IndexToBlock();
  }
  else {
    uVar9 = (uint)__new_size - 0x10;
    __new_size = (size_t)uVar9;
    if (-1 < (int)uVar9) {
      pAVar2 = (pvVar3->
               super__Vector_base<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)uVar9 <
          (ulong)((long)(pvVar3->
                        super__Vector_base<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pAVar2 >> 4)) {
        return pAVar2 + uVar9;
      }
      goto LAB_0012f42a;
    }
  }
  IndexToBlock();
LAB_0012f42a:
  IndexToBlock();
  if (__new_size == 0) {
    return (AllocatedBlock *)0x0;
  }
  if (0 < (int)extraout_EDX) {
    uVar5 = (ulong)(int)extraout_EDX;
    uVar1 = uVar5 - 1;
    if ((uVar5 & uVar1) == 0) {
      if (this_00->block_size_ >> 2 < __new_size) {
        if (extraout_EDX < 9) {
          pAVar6 = AllocNewBlock(this_00,__new_size);
          return (AllocatedBlock *)pAVar6->mem;
        }
        __assert_fail("align <= kDefaultAlignment",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/base/arena.cc"
                      ,0x116,
                      "void *ctemplate::BaseArena::GetMemoryFallback(const size_t, const int)");
      }
      uVar7 = uVar1 & (ulong)this_00->freestart_;
      if (uVar7 != 0) {
        uVar5 = uVar5 - uVar7;
        this_00->freestart_ = this_00->freestart_ + uVar5;
        sVar8 = 0;
        if (uVar5 <= this_00->remaining_) {
          sVar8 = this_00->remaining_ - uVar5;
        }
        this_00->remaining_ = sVar8;
      }
      if (this_00->remaining_ < __new_size) {
        pAVar6 = AllocNewBlock(this_00,this_00->block_size_);
        this_00->freestart_ = pAVar6->mem;
        this_00->remaining_ = pAVar6->size;
      }
      this_00->remaining_ = this_00->remaining_ - __new_size;
      pAVar6 = (AllocatedBlock *)this_00->freestart_;
      this_00->last_alloc_ = (char *)pAVar6;
      this_00->freestart_ = (char *)((long)&pAVar6->mem + __new_size);
      if ((uVar1 & (ulong)pAVar6) == 0) {
        return pAVar6;
      }
      __assert_fail("0 == (reinterpret_cast<uintptr_t>(last_alloc_) & (align-1))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/base/arena.cc"
                    ,0x12d,"void *ctemplate::BaseArena::GetMemoryFallback(const size_t, const int)")
      ;
    }
  }
  __assert_fail("align_as_int > 0 && 0 == (align & (align - 1))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/base/arena.cc"
                ,0x110,"void *ctemplate::BaseArena::GetMemoryFallback(const size_t, const int)");
}

Assistant:

BaseArena::AllocatedBlock*  BaseArena::AllocNewBlock(const size_t block_size) {
  AllocatedBlock *block;
  // Find the next block.
  if ( blocks_alloced_ < ARRAYSIZE(first_blocks_) ) {
    // Use one of the pre-allocated blocks
    block = &first_blocks_[blocks_alloced_++];
  } else {                   // oops, out of space, move to the vector
    if (overflow_blocks_ == NULL) overflow_blocks_ = new vector<AllocatedBlock>;
    // Adds another block to the vector.
    overflow_blocks_->resize(overflow_blocks_->size()+1);
    // block points to the last block of the vector.
    block = &overflow_blocks_->back();
  }

  if (page_aligned_) {
    // We need the size to be multiple of kPageSize to mprotect it later.
    size_t num_pages = ((block_size - 1) / kPageSize) + 1;
    size_t new_block_size = num_pages * kPageSize;
    block->mem = reinterpret_cast<char*>(aligned_malloc(new_block_size,
                                                        kPageSize));
    PCHECK(NULL != block->mem);
    block->size = new_block_size;
  } else {
    block->mem = reinterpret_cast<char*>(malloc(block_size));
    block->size = block_size;
  }

  ARENASET(status_.bytes_allocated_ += block_size);

  return block;
}